

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

int32_t ncat(char *buffer,uint32_t buflen,...)

{
  bool bVar1;
  long *local_120;
  long local_108 [22];
  char local_51;
  char c;
  char *e;
  char *p;
  char *str;
  va_list args;
  uint32_t buflen_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (buflen == 0)) {
    buffer_local._4_4_ = -1;
  }
  else {
    args[0]._0_8_ = &stack0x00000008;
    str._0_4_ = 0x10;
    e = buffer;
    while( true ) {
      if ((uint)str < 0x29) {
        local_120 = (long *)((long)local_108 + (long)(int)(uint)str);
        str._0_4_ = (uint)str + 8;
      }
      else {
        local_120 = (long *)args[0]._0_8_;
        args[0]._0_8_ = args[0]._0_8_ + 8;
      }
      p = (char *)*local_120;
      if (p == (char *)0x0) break;
      while( true ) {
        bVar1 = false;
        if (e != buffer + ((ulong)buflen - 1)) {
          local_51 = *p;
          bVar1 = local_51 != '\0';
          p = p + 1;
        }
        if (!bVar1) break;
        *e = local_51;
        e = e + 1;
      }
    }
    *e = '\0';
    buffer_local._4_4_ = (int)e - (int)buffer;
  }
  return buffer_local._4_4_;
}

Assistant:

static int32_t ncat(char *buffer, uint32_t buflen, ...) {
  va_list args;
  char *str;
  char *p = buffer;
  const char* e = buffer + buflen - 1;

  if (buffer == NULL || buflen < 1) {
    return -1;
  }

  va_start(args, buflen);
  while ((str = va_arg(args, char *)) != 0) {
    char c;
    while (p != e && (c = *str++) != 0) {
      *p++ = c;
    }
  }
  *p = 0;
  va_end(args);

  return static_cast<int32_t>(p - buffer);
}